

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextShutdown(ImGuiContext *ctx)

{
  ImGuiStoragePair *pIVar1;
  int n;
  int i;
  
  for (i = 0; i < (ctx->DockContext).Nodes.Data.Size; i = i + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,i);
    if ((ImGuiDockNode *)(pIVar1->field_1).val_p != (ImGuiDockNode *)0x0) {
      IM_DELETE<ImGuiDockNode>((ImGuiDockNode *)(pIVar1->field_1).val_p);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextShutdown(ImGuiContext* ctx)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            IM_DELETE(node);
}